

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Versions.cpp
# Opt level: O1

void __thiscall
glslang::TParseVersions::requireInt8Arithmetic
          (TParseVersions *this,TSourceLoc *loc,char *op,char *featureDesc)

{
  size_t __len2;
  char *extensions [2];
  TString combined;
  undefined4 local_68;
  undefined4 uStack_64;
  undefined4 uStack_60;
  undefined4 uStack_5c;
  basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> local_50;
  
  local_50._M_dataplus.super_allocator_type.allocator = GetThreadPoolAllocator();
  local_50._M_string_length = 0;
  local_50.field_2._M_local_buf[0] = '\0';
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  __len2 = strlen(op);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
  _M_replace(&local_50,0,0,op,__len2);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::append
            (&local_50,": ");
  std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::append
            (&local_50,featureDesc);
  local_68 = 0x7027a9;
  uStack_64 = 0;
  uStack_60 = 0x7027d1;
  uStack_5c = 0;
  (*this->_vptr_TParseVersions[5])(this,loc,2,&local_68,local_50._M_dataplus._M_p);
  return;
}

Assistant:

void TParseVersions::requireInt8Arithmetic(const TSourceLoc& loc, const char* op, const char* featureDesc)
{
    TString combined;
    combined = op;
    combined += ": ";
    combined += featureDesc;

    const char* const extensions[] = {
                                       E_GL_EXT_shader_explicit_arithmetic_types,
                                       E_GL_EXT_shader_explicit_arithmetic_types_int8};
    requireExtensions(loc, sizeof(extensions)/sizeof(extensions[0]), extensions, combined.c_str());
}